

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_concat.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nlohmann::json_abi_v3_11_3::detail::
concat<std::__cxx11::string,std::__cxx11::string,char_const(&)[12],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,std::__cxx11::string_const&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [12],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          char (*args_3) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = *(long *)(this + 8);
  sVar3 = strlen((char *)args);
  lVar2 = *(long *)(*args_1 + 8);
  sVar4 = strlen((char *)args_2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             lVar1 + sVar3 + lVar2 + sVar4 + *(long *)(args_3[2] + 2) + args_4->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,*(char **)this,*(size_type *)(this + 8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,(char *)args);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,*(char **)*args_1,*(size_type *)(*args_1 + 8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,(char *)args_2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,*(char **)args_3,*(size_type *)(args_3[2] + 2));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,(args_4->_M_dataplus)._M_p,args_4->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(args...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}